

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

Curl_addrinfo * addr_next_match(Curl_addrinfo *addr,int family)

{
  bool bVar1;
  Curl_addrinfo *pCStack_18;
  int family_local;
  Curl_addrinfo *addr_local;
  
  pCStack_18 = addr;
  while( true ) {
    bVar1 = false;
    if (pCStack_18 != (Curl_addrinfo *)0x0) {
      bVar1 = pCStack_18->ai_next != (Curl_addrinfo *)0x0;
    }
    if (!bVar1) break;
    pCStack_18 = pCStack_18->ai_next;
    if (pCStack_18->ai_family == family) {
      return pCStack_18;
    }
  }
  return (Curl_addrinfo *)0x0;
}

Assistant:

static const struct Curl_addrinfo *
addr_next_match(const struct Curl_addrinfo *addr, int family)
{
  while(addr && addr->ai_next) {
    addr = addr->ai_next;
    if(addr->ai_family == family)
      return addr;
  }
  return NULL;
}